

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O0

char * strnstr(char *string1,char *string2,size_t len)

{
  int iVar1;
  size_t __n;
  ulong in_RDX;
  char *in_RSI;
  char *in_RDI;
  size_t length2;
  ulong local_20;
  char *local_10;
  char *local_8;
  
  __n = strlen(in_RSI);
  local_20 = in_RDX;
  local_10 = in_RDI;
  local_8 = in_RDI;
  if (__n != 0) {
    while (__n <= local_20) {
      local_20 = local_20 - 1;
      iVar1 = memcmp(local_10,in_RSI,__n);
      if (iVar1 == 0) {
        return local_10;
      }
      local_10 = local_10 + 1;
    }
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

char* strnstr(const char* string1, const char* string2, size_t len)
{
    size_t length2;

    length2 = strlen(string2);
    if (!length2) {
        return (char*)string1;
    }

    while (len >= length2) {
        len--;
        if (!memcmp(string1, string2, length2))
            return (char*)string1;
        string1++;
    }
    return NULL;
}